

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O3

DecoratorPtrList * __thiscall
Rml::StyleSheet::InstanceDecorators
          (StyleSheet *this,RenderManager *render_manager,DecoratorDeclarationList *declaration_list
          ,PropertySource *source)

{
  pointer pDVar1;
  DecoratorInstancer *pDVar2;
  code *pcVar3;
  bool bVar4;
  size_t sVar5;
  DecoratorPtrList *this_00;
  Node *pNVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  char *pcVar7;
  ulong uVar8;
  Node *pNVar9;
  pointer key_00;
  String key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  shared_ptr<const_Rml::Decorator> local_70;
  PropertySource *local_60;
  RenderManager *local_58;
  RenderManager *local_50;
  StyleSheet *local_48;
  String *local_40;
  Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  *local_38;
  
  local_58 = render_manager;
  if ((InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
       ::rmlui_nonrecursive_entered == '\x01') &&
     (bVar4 = Assert("A method defined as non-recursive was entered twice!",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Debug.h"
                     ,0x75), !bVar4)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
  ::rmlui_nonrecursive_entered = '\x01';
  if (InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
      ::non_cached_decorator_list == '\0') {
    InstanceDecorators();
  }
  local_40 = &declaration_list->value;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  if ((declaration_list->value)._M_string_length == 0) {
    this_00 = &InstanceDecorators::non_cached_decorator_list;
    ::std::
    vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
    ::clear(&InstanceDecorators::non_cached_decorator_list);
  }
  else {
    ::std::__cxx11::string::reserve((ulong)&local_90);
    ::std::__cxx11::string::_M_assign((string *)&local_90);
    ::std::__cxx11::string::push_back((char)&local_90);
    if (source != (PropertySource *)0x0) {
      ::std::__cxx11::string::_M_append((char *)&local_90,(ulong)(source->path)._M_dataplus._M_p);
    }
    sVar5 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::findIdx<std::__cxx11::string>
                      ((Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)&this->decorator_cache,&local_90);
    pNVar9 = (this->decorator_cache).mKeyVals + sVar5;
    if (pNVar9 != (Node *)(this->decorator_cache).mInfo) {
      this_00 = &(pNVar9->mData).second;
      goto LAB_00266648;
    }
    this_00 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::
              doCreateByKey<std::__cxx11::string_const&,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>>
                        ((Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)&this->decorator_cache,&local_90);
  }
  ::std::
  vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
  ::reserve(this_00,((long)(declaration_list->list).
                           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(declaration_list->list).
                           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  key_00 = (declaration_list->list).
           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (declaration_list->list).
           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (key_00 != pDVar1) {
    local_38 = (Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                *)&this->named_decorator_map;
    do {
      pDVar2 = key_00->instancer;
      if (pDVar2 == (DecoratorInstancer *)0x0) {
        sVar5 = robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::findIdx<std::__cxx11::string>(local_38,&key_00->type);
        pNVar6 = (this->named_decorator_map).mKeyVals + sVar5;
        if (pNVar6 == (Node *)(this->named_decorator_map).mInfo) {
          local_48 = (StyleSheet *)0x0;
        }
        else {
          pDVar2 = (pNVar6->mData).second.instancer;
          local_70.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_58;
          local_70.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
          local_60 = source;
          (*pDVar2->_vptr_DecoratorInstancer[2])
                    (&local_50,pDVar2,&(pNVar6->mData).second,&(pNVar6->mData).second.properties,
                     &local_70);
          if (local_50 != (RenderManager *)0x0) goto LAB_0026656d;
        }
        if (source == (PropertySource *)0x0) {
          uVar8 = 0xffffffff;
          pcVar7 = "";
        }
        else {
          pcVar7 = (source->path)._M_dataplus._M_p;
          uVar8 = (ulong)(uint)source->line_number;
        }
        Log::Message(LT_WARNING,
                     "Decorator name \'%s\' could not be found in any @decorator rule, declared at %s:%d"
                     ,(key_00->type)._M_dataplus._M_p,pcVar7,uVar8);
LAB_00266633:
        ::std::
        vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
        ::clear(this_00);
        if (local_48 != (StyleSheet *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
        }
        break;
      }
      local_70.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_58;
      local_70.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      local_60 = source;
      (*pDVar2->_vptr_DecoratorInstancer[2])(&local_50,pDVar2,key_00,&key_00->properties,&local_70);
      if (local_50 == (RenderManager *)0x0) {
        if (source == (PropertySource *)0x0) {
          uVar8 = 0xffffffff;
          pcVar7 = "";
        }
        else {
          pcVar7 = (source->path)._M_dataplus._M_p;
          uVar8 = (ulong)(uint)source->line_number;
        }
        Log::Message(LT_WARNING,
                     "Decorator \'%s\' in \'%s\' could not be instanced, declared at %s:%d",
                     (key_00->type)._M_dataplus._M_p,(local_40->_M_dataplus)._M_p,pcVar7,uVar8);
        goto LAB_00266633;
      }
LAB_0026656d:
      local_70.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_50;
      local_70.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
      ::std::
      vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
      ::emplace_back<std::shared_ptr<Rml::Decorator_const>>
                ((vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
                  *)this_00,&local_70);
      if ((StyleSheet *)
          local_70.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (StyleSheet *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      key_00 = key_00 + 1;
    } while (key_00 != pDVar1);
  }
LAB_00266648:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
  ::rmlui_nonrecursive_entered = '\0';
  return (DecoratorPtrList *)
         (vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
          *)this_00;
}

Assistant:

const DecoratorPtrList& StyleSheet::InstanceDecorators(RenderManager& render_manager, const DecoratorDeclarationList& declaration_list,
	const PropertySource* source) const
{
	RMLUI_ASSERT_NONRECURSIVE; // Since we may return a reference to the below static variable.
	static DecoratorPtrList non_cached_decorator_list;

	// Empty declaration values are used for interpolated values which we don't want to cache.
	const bool enable_cache = !declaration_list.value.empty();

	// Generate the cache key. Relative paths of textures may be affected by the source path, and ultimately
	// which texture should be displayed. Thus, we need to include this path in the cache key.
	String key;

	if (enable_cache)
	{
		key.reserve(declaration_list.value.size() + 1 + (source ? source->path.size() : 0));
		key = declaration_list.value;
		key += ';';
		if (source)
			key += source->path;

		auto it_cache = decorator_cache.find(key);
		if (it_cache != decorator_cache.end())
			return it_cache->second;
	}
	else
	{
		non_cached_decorator_list.clear();
	}

	DecoratorPtrList& decorators = enable_cache ? decorator_cache[key] : non_cached_decorator_list;
	decorators.reserve(declaration_list.list.size());

	for (const DecoratorDeclaration& declaration : declaration_list.list)
	{
		SharedPtr<Decorator> decorator;

		if (declaration.instancer)
		{
			RMLUI_ZoneScopedN("InstanceDecorator");
			decorator = declaration.instancer->InstanceDecorator(declaration.type, declaration.properties,
				DecoratorInstancerInterface(render_manager, *this, source));

			if (!decorator)
				Log::Message(Log::LT_WARNING, "Decorator '%s' in '%s' could not be instanced, declared at %s:%d", declaration.type.c_str(),
					declaration_list.value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
		}
		else
		{
			// If we have no instancer, this means the type is the name of an @decorator rule.
			auto it_map = named_decorator_map.find(declaration.type);
			if (it_map != named_decorator_map.end())
				decorator = it_map->second.instancer->InstanceDecorator(it_map->second.type, it_map->second.properties,
					DecoratorInstancerInterface(render_manager, *this, source));

			if (!decorator)
				Log::Message(Log::LT_WARNING, "Decorator name '%s' could not be found in any @decorator rule, declared at %s:%d",
					declaration.type.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
		}

		if (!decorator)
		{
			decorators.clear();
			break;
		}

		decorators.push_back(std::move(decorator));
	}

	return decorators;
}